

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O0

Mat * filter_arrow(Mat *img,array<cv::Mat,_5UL> *target_filled,bool debug)

{
  ulong uVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference m;
  _InputArray *p_Var5;
  byte in_CL;
  undefined7 in_register_00000011;
  int in_R8D;
  undefined1 local_b88 [32];
  Point_<int> local_b68;
  Mat local_b60 [96];
  _InputArray local_b00;
  _OutputArray local_ae8;
  _InputArray local_ad0;
  undefined1 local_ab8 [32];
  Point_<int> local_a98;
  Mat local_a90 [96];
  _InputArray local_a30;
  _OutputArray local_a18;
  _InputArray local_a00;
  _OutputArray local_9e8;
  _InputArray local_9d0;
  _InputArray local_9b8;
  ulong local_9a0;
  size_t i_1;
  allocator<char> local_979;
  string local_978 [39];
  allocator<char> local_951;
  string local_950 [32];
  Mat *local_930;
  value_type *mat_1;
  iterator __end2_1;
  iterator __begin2_1;
  array<cv::Mat,_4UL> *__range2_1;
  _InputArray local_8f8;
  _InputArray local_8e0;
  ulong local_8c8;
  size_t i;
  allocator<char> local_8a1;
  string local_8a0 [39];
  allocator<char> local_879;
  string local_878 [32];
  Mat *local_858;
  value_type *mat;
  iterator __end2;
  iterator __begin2;
  array<cv::Mat,_4UL> *__range2;
  Scalar_<double> local_820;
  _InputArray local_800;
  Scalar_<double> local_7e8;
  _InputArray local_7c8;
  _InputArray local_7b0;
  _InputArray local_798;
  _InputArray local_780;
  undefined1 local_761;
  Mat local_760 [96];
  Scalar_<double> local_700;
  Scalar_ local_6e0 [352];
  Mat local_580 [96];
  Scalar_<double> local_520;
  Scalar_ local_500 [352];
  Mat local_3a0 [112];
  Scalar_<double> local_330;
  Scalar_ local_310 [352];
  MatExpr *local_1b0;
  undefined1 local_1a8 [8];
  array<cv::Mat,_4UL> colours;
  bool debug_local;
  array<cv::Mat,_5UL> *target_filled_local;
  Mat *img_local;
  
  colours._383_1_ = in_CL & 1;
  local_761 = 1;
  local_1b0 = (MatExpr *)local_1a8;
  cv::Scalar_<double>::Scalar_(&local_330,255.0);
  filter_yellow(local_3a0);
  cv::operator-(local_310,(Mat *)&local_330);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)local_1a8);
  local_1b0 = (MatExpr *)&colours.field_0x58;
  cv::Scalar_<double>::Scalar_(&local_520,255.0);
  filter_red(local_580);
  cv::operator-(local_500,(Mat *)&local_520);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&colours.field_0x58);
  local_1b0 = (MatExpr *)&colours.field_0xb8;
  cv::Scalar_<double>::Scalar_(&local_700,255.0);
  filter_blue(local_760);
  cv::operator-(local_6e0,(Mat *)&local_700);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&colours.field_0xb8);
  local_1b0 = (MatExpr *)&colours.field_0x118;
  cv::Mat::clone();
  local_761 = 0;
  cv::MatExpr::~MatExpr((MatExpr *)local_6e0);
  cv::Mat::~Mat(local_760);
  cv::MatExpr::~MatExpr((MatExpr *)local_500);
  cv::Mat::~Mat(local_580);
  cv::MatExpr::~MatExpr((MatExpr *)local_310);
  cv::Mat::~Mat(local_3a0);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,3);
  cv::_InputArray::_InputArray(&local_780,pvVar2);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,3);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_798,pvVar2);
  cv::cvtColor((cv *)&local_780,&local_798,(_OutputArray *)0x43,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_798);
  cv::_InputArray::~_InputArray(&local_780);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,3);
  cv::_InputArray::_InputArray(&local_7b0,pvVar2);
  cv::Scalar_<double>::Scalar_(&local_7e8,0.0,0.0,0.0,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_7c8,(Matx<double,_4,_1> *)&local_7e8);
  cv::Scalar_<double>::Scalar_(&local_820,255.0,140.0,80.0,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_800,(Matx<double,_4,_1> *)&local_820);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,3);
  cv::_OutputArray::_OutputArray((_OutputArray *)&__range2,pvVar2);
  cv::inRange(&local_7b0,&local_7c8,&local_800,(_OutputArray *)&__range2);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&__range2);
  cv::_InputArray::~_InputArray(&local_800);
  cv::_InputArray::~_InputArray(&local_7c8);
  cv::_InputArray::~_InputArray(&local_7b0);
  if ((colours._383_1_ & 1) != 0) {
    __begin2 = (iterator)local_1a8;
    __end2 = std::array<cv::Mat,_4UL>::begin((array<cv::Mat,_4UL> *)__begin2);
    mat = std::array<cv::Mat,_4UL>::end((array<cv::Mat,_4UL> *)__begin2);
    for (; __end2 != mat; __end2 = __end2 + 0x60) {
      local_858 = __end2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_878,"black_layer",&local_879);
      cv::namedWindow(local_878,0);
      std::__cxx11::string::~string(local_878);
      std::allocator<char>::~allocator(&local_879);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_8a0,"black_layer",&local_8a1);
      cv::_InputArray::_InputArray((_InputArray *)&i,local_858);
      cv::imshow(local_8a0,(_InputArray *)&i);
      cv::_InputArray::~_InputArray((_InputArray *)&i);
      std::__cxx11::string::~string(local_8a0);
      std::allocator<char>::~allocator(&local_8a1);
      cv::waitKey(0);
      cv::destroyAllWindows();
    }
  }
  sVar3 = std::array<cv::Mat,_5UL>::size
                    ((array<cv::Mat,_5UL> *)CONCAT71(in_register_00000011,debug));
  sVar4 = std::array<cv::Mat,_4UL>::size((array<cv::Mat,_4UL> *)local_1a8);
  if (sVar3 < sVar4) {
    __assert_fail("colours.size() > 3 && target_filled.size() >= colours.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/colour_filters.cpp"
                  ,0x3d,
                  "cv::Mat filter_arrow(const cv::Mat &, const std::array<cv::Mat, 5> &, bool)");
  }
  for (local_8c8 = 0; local_8c8 < 3; local_8c8 = local_8c8 + 1) {
    pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,local_8c8);
    cv::_InputArray::_InputArray(&local_8e0,pvVar2);
    m = std::array<cv::Mat,_5UL>::operator[]
                  ((array<cv::Mat,_5UL> *)CONCAT71(in_register_00000011,debug),local_8c8);
    cv::_InputArray::_InputArray(&local_8f8,m);
    pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,local_8c8);
    cv::_OutputArray::_OutputArray((_OutputArray *)&__range2_1,pvVar2);
    p_Var5 = (_InputArray *)cv::noArray();
    cv::bitwise_and(&local_8e0,&local_8f8,(_OutputArray *)&__range2_1,p_Var5);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&__range2_1);
    cv::_InputArray::~_InputArray(&local_8f8);
    cv::_InputArray::~_InputArray(&local_8e0);
  }
  if ((colours._383_1_ & 1) != 0) {
    __begin2_1 = (iterator)local_1a8;
    __end2_1 = std::array<cv::Mat,_4UL>::begin((array<cv::Mat,_4UL> *)__begin2_1);
    mat_1 = std::array<cv::Mat,_4UL>::end((array<cv::Mat,_4UL> *)__begin2_1);
    for (; __end2_1 != mat_1; __end2_1 = __end2_1 + 0x60) {
      local_930 = __end2_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_950,"cleaned black_layer",&local_951)
      ;
      cv::namedWindow(local_950,0);
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator(&local_951);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_978,"cleaned black_layer",&local_979)
      ;
      cv::_InputArray::_InputArray((_InputArray *)&i_1,local_930);
      cv::imshow(local_978,(_InputArray *)&i_1);
      cv::_InputArray::~_InputArray((_InputArray *)&i_1);
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator(&local_979);
      cv::waitKey(0);
      cv::destroyAllWindows();
    }
  }
  for (local_9a0 = 1; uVar1 = local_9a0,
      sVar3 = std::array<cv::Mat,_4UL>::size((array<cv::Mat,_4UL> *)local_1a8), uVar1 < sVar3;
      local_9a0 = local_9a0 + 1) {
    pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
    cv::_InputArray::_InputArray(&local_9b8,pvVar2);
    pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,local_9a0);
    cv::_InputArray::_InputArray(&local_9d0,pvVar2);
    pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
    cv::_OutputArray::_OutputArray(&local_9e8,pvVar2);
    p_Var5 = (_InputArray *)cv::noArray();
    cv::bitwise_or(&local_9b8,&local_9d0,&local_9e8,p_Var5);
    cv::_OutputArray::~_OutputArray(&local_9e8);
    cv::_InputArray::~_InputArray(&local_9d0);
    cv::_InputArray::~_InputArray(&local_9b8);
  }
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
  cv::_InputArray::_InputArray(&local_a00,pvVar2);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
  cv::_OutputArray::_OutputArray(&local_a18,pvVar2);
  cv::Mat::Mat(local_a90);
  cv::_InputArray::_InputArray(&local_a30,local_a90);
  cv::Point_<int>::Point_(&local_a98,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_a00,&local_a18,&local_a30,&local_a98,4,0,local_ab8);
  cv::_InputArray::~_InputArray(&local_a30);
  cv::Mat::~Mat(local_a90);
  cv::_OutputArray::~_OutputArray(&local_a18);
  cv::_InputArray::~_InputArray(&local_a00);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
  cv::_InputArray::_InputArray(&local_ad0,pvVar2);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
  cv::_OutputArray::_OutputArray(&local_ae8,pvVar2);
  cv::Mat::Mat(local_b60,8,8,0);
  cv::_InputArray::_InputArray(&local_b00,local_b60);
  cv::Point_<int>::Point_(&local_b68,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_ad0,&local_ae8,&local_b00,&local_b68,8,0,local_b88);
  cv::_InputArray::~_InputArray(&local_b00);
  cv::Mat::~Mat(local_b60);
  cv::_OutputArray::~_OutputArray(&local_ae8);
  cv::_InputArray::~_InputArray(&local_ad0);
  pvVar2 = std::array<cv::Mat,_4UL>::operator[]((array<cv::Mat,_4UL> *)local_1a8,0);
  cv::Mat::Mat(img,pvVar2);
  std::array<cv::Mat,_4UL>::~array((array<cv::Mat,_4UL> *)local_1a8);
  return img;
}

Assistant:

cv::Mat filter_arrow(const cv::Mat& img, const std::array<cv::Mat, 5>& target_filled, bool debug)
{
    std::array<cv::Mat, 4> colours {
        255 - filter_yellow(img), 255 - filter_red(img), 255 - filter_blue(img), img.clone()};
    cv::cvtColor(colours[3], colours[3], cv::COLOR_RGB2HSV_FULL);
    cv::inRange(colours[3], cv::Scalar(0, 0, 0), cv::Scalar(255, 140, 80), colours[3]);

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("black_layer", cv::WINDOW_NORMAL);
            cv::imshow("black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }
    assert(colours.size() > 3 && target_filled.size() >= colours.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        cv::bitwise_and(colours[i], target_filled[i], colours[i]);
    }

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("cleaned black_layer", cv::WINDOW_NORMAL);
            cv::imshow("cleaned black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }

    for(std::size_t i = 1; i < colours.size(); i++)
    {
        cv::bitwise_or(colours[0], colours[i], colours[0]);
    }

    cv::erode(colours[0], colours[0], cv::Mat(), cv::Point(-1, -1), 4);
    cv::dilate(colours[0], colours[0], cv::Mat(8, 8, 0), cv::Point(-1, -1), 8);

    return colours[0];
}